

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

With * sqlite3WithDup(sqlite3 *db,With *p)

{
  int iVar1;
  With *pWVar2;
  Select *pSVar3;
  ExprList *pEVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  
  if ((p != (With *)0x0) &&
     (pWVar2 = (With *)sqlite3DbMallocZero(db,(long)p->nCte * 0x30 + 0x10), pWVar2 != (With *)0x0))
  {
    iVar1 = p->nCte;
    pWVar2->nCte = iVar1;
    lVar6 = 0x10;
    for (lVar7 = 0; lVar7 < iVar1; lVar7 = lVar7 + 1) {
      pSVar3 = sqlite3SelectDup(db,*(Select **)((long)&p->a[0].zName + lVar6),0);
      *(Select **)((long)&pWVar2->a[0].zName + lVar6) = pSVar3;
      pEVar4 = sqlite3ExprListDup(db,*(ExprList **)((long)p->a + lVar6 + -8),0);
      *(ExprList **)((long)pWVar2->a + lVar6 + -8) = pEVar4;
      pcVar5 = sqlite3DbStrDup(db,*(char **)((long)p->a + lVar6 + -0x10));
      *(char **)((long)pWVar2->a + lVar6 + -0x10) = pcVar5;
      *(undefined1 *)((long)&pWVar2->a[0].zCteErr + lVar6) =
           *(undefined1 *)((long)&p->a[0].zCteErr + lVar6);
      iVar1 = p->nCte;
      lVar6 = lVar6 + 0x30;
    }
    return pWVar2;
  }
  return (With *)0x0;
}

Assistant:

SQLITE_PRIVATE With *sqlite3WithDup(sqlite3 *db, With *p){
  With *pRet = 0;
  if( p ){
    sqlite3_int64 nByte = sizeof(*p) + sizeof(p->a[0]) * (p->nCte-1);
    pRet = sqlite3DbMallocZero(db, nByte);
    if( pRet ){
      int i;
      pRet->nCte = p->nCte;
      for(i=0; i<p->nCte; i++){
        pRet->a[i].pSelect = sqlite3SelectDup(db, p->a[i].pSelect, 0);
        pRet->a[i].pCols = sqlite3ExprListDup(db, p->a[i].pCols, 0);
        pRet->a[i].zName = sqlite3DbStrDup(db, p->a[i].zName);
        pRet->a[i].eM10d = p->a[i].eM10d;
      }
    }
  }
  return pRet;
}